

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

void little2_updatePosition(ENCODING *enc,char *ptr,char *end,POSITION *pos)

{
  byte bVar1;
  long lVar2;
  byte *pbVar3;
  undefined1 uVar4;
  bool bVar5;
  
  lVar2 = -(long)ptr;
  do {
    if ((long)(end + lVar2) < 2) {
      return;
    }
    bVar1 = ((byte *)ptr)[1];
    if (bVar1 < 0xdc) {
      uVar4 = 7;
      if (3 < bVar1 - 0xd8) {
        if (bVar1 == 0) {
          uVar4 = *(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr);
        }
        else {
LAB_0017f151:
          uVar4 = 0x1d;
        }
      }
    }
    else if (bVar1 - 0xdc < 4) {
      uVar4 = 8;
    }
    else {
      if ((bVar1 != 0xff) || ((byte)*ptr < 0xfe)) goto LAB_0017f151;
      uVar4 = 0;
    }
    switch(uVar4) {
    default:
      pbVar3 = (byte *)ptr + 2;
      break;
    case 6:
      pbVar3 = (byte *)ptr + 3;
      break;
    case 7:
      pbVar3 = (byte *)ptr + 4;
      break;
    case 9:
      pos->lineNumber = pos->lineNumber + 1;
      pbVar3 = (byte *)ptr + 2;
      if (1 < (long)end - (long)pbVar3) {
        if (((byte *)ptr)[3] == 0) {
          bVar5 = *(char *)((long)enc[1].scanners + (ulong)*pbVar3) == '\n';
        }
        else {
          bVar5 = false;
        }
        if (bVar5) {
          pbVar3 = (byte *)ptr + 4;
        }
      }
      pos->columnNumber = 0;
      goto LAB_0017f180;
    case 10:
      pos->columnNumber = 0;
      pos->lineNumber = pos->lineNumber + 1;
      pbVar3 = (byte *)ptr + 2;
      goto LAB_0017f180;
    }
    pos->columnNumber = pos->columnNumber + 1;
LAB_0017f180:
    lVar2 = -(long)pbVar3;
    ptr = (char *)pbVar3;
  } while( true );
}

Assistant:

static void PTRCALL
PREFIX(updatePosition)(const ENCODING *enc, const char *ptr, const char *end,
                       POSITION *pos) {
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    ptr += n; /* NOTE: The encoding has already been validated. */             \
    pos->columnNumber++;                                                       \
    break;
      LEAD_CASE(2)
      LEAD_CASE(3)
      LEAD_CASE(4)
#  undef LEAD_CASE
    case BT_LF:
      pos->columnNumber = 0;
      pos->lineNumber++;
      ptr += MINBPC(enc);
      break;
    case BT_CR:
      pos->lineNumber++;
      ptr += MINBPC(enc);
      if (HAS_CHAR(enc, ptr, end) && BYTE_TYPE(enc, ptr) == BT_LF)
        ptr += MINBPC(enc);
      pos->columnNumber = 0;
      break;
    default:
      ptr += MINBPC(enc);
      pos->columnNumber++;
      break;
    }
  }
}